

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionDispatcher.cpp
# Opt level: O1

void __thiscall
cbtCollisionDispatcher::cbtCollisionDispatcher
          (cbtCollisionDispatcher *this,cbtCollisionConfiguration *collisionConfiguration)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  cbtCollisionAlgorithmCreateFunc *(*papcVar2) [42];
  ulong uVar3;
  int j;
  ulong uVar4;
  
  (this->super_cbtDispatcher)._vptr_cbtDispatcher =
       (_func_int **)&PTR__cbtCollisionDispatcher_00b6f9d8;
  this->m_dispatcherFlags = 2;
  (this->m_manifoldsPtr).m_ownsMemory = true;
  (this->m_manifoldsPtr).m_data = (cbtPersistentManifold **)0x0;
  (this->m_manifoldsPtr).m_size = 0;
  (this->m_manifoldsPtr).m_capacity = 0;
  (this->m_defaultManifoldResult).super_Result._vptr_Result = (_func_int **)&PTR__Result_00b70508;
  (this->m_defaultManifoldResult).m_closestPointDistanceThreshold = 0.0;
  this->m_collisionConfiguration = collisionConfiguration;
  this->m_nearCallback = defaultNearCallback;
  iVar1 = (*collisionConfiguration->_vptr_cbtCollisionConfiguration[3])(collisionConfiguration);
  this->m_collisionAlgorithmPoolAllocator = (cbtPoolAllocator *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*collisionConfiguration->_vptr_cbtCollisionConfiguration[2])(collisionConfiguration);
  this->m_persistentManifoldPoolAllocator = (cbtPoolAllocator *)CONCAT44(extraout_var_00,iVar1);
  papcVar2 = this->m_doubleDispatchClosestPoints;
  uVar3 = 0;
  do {
    uVar4 = 0;
    do {
      iVar1 = (*this->m_collisionConfiguration->_vptr_cbtCollisionConfiguration[4])
                        (this->m_collisionConfiguration,uVar3 & 0xffffffff,uVar4 & 0xffffffff);
      papcVar2[-0x2a][uVar4] = (cbtCollisionAlgorithmCreateFunc *)CONCAT44(extraout_var_01,iVar1);
      iVar1 = (*this->m_collisionConfiguration->_vptr_cbtCollisionConfiguration[5])
                        (this->m_collisionConfiguration,uVar3 & 0xffffffff,uVar4 & 0xffffffff);
      (*papcVar2)[uVar4] = (cbtCollisionAlgorithmCreateFunc *)CONCAT44(extraout_var_02,iVar1);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0x2a);
    uVar3 = uVar3 + 1;
    papcVar2 = papcVar2 + 1;
  } while (uVar3 != 0x2a);
  return;
}

Assistant:

cbtCollisionDispatcher::cbtCollisionDispatcher(cbtCollisionConfiguration* collisionConfiguration) : m_dispatcherFlags(cbtCollisionDispatcher::CD_USE_RELATIVE_CONTACT_BREAKING_THRESHOLD),
																								 m_collisionConfiguration(collisionConfiguration)
{
	int i;

	setNearCallback(defaultNearCallback);

	m_collisionAlgorithmPoolAllocator = collisionConfiguration->getCollisionAlgorithmPool();

	m_persistentManifoldPoolAllocator = collisionConfiguration->getPersistentManifoldPool();

	for (i = 0; i < MAX_BROADPHASE_COLLISION_TYPES; i++)
	{
		for (int j = 0; j < MAX_BROADPHASE_COLLISION_TYPES; j++)
		{
			m_doubleDispatchContactPoints[i][j] = m_collisionConfiguration->getCollisionAlgorithmCreateFunc(i, j);
			cbtAssert(m_doubleDispatchContactPoints[i][j]);
			m_doubleDispatchClosestPoints[i][j] = m_collisionConfiguration->getClosestPointsAlgorithmCreateFunc(i, j);
		}
	}
}